

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O3

void optimal_optimize(_encode_match_data *emd,matchp_enum_get_next_f *f,void *matchp_enum)

{
  int *piVar1;
  ushort uVar2;
  unsigned_short uVar3;
  void *pvVar4;
  undefined8 *puVar5;
  log_level lVar6;
  int iVar7;
  const_matchp pmVar8;
  interval_nodep p_Var9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  char *printf_str;
  long lVar14;
  bool bVar15;
  float fVar16;
  
  pvVar4 = emd->priv;
  memset(optimal_optimize::offset_arr,0,0x200000);
  memset(optimal_optimize::offset_parr,0,0x200000);
  memset(optimal_optimize::len_arr,0,0x40000);
  puVar5 = *(undefined8 **)((long)pvVar4 + 0x28);
  pmVar8 = (*f)(matchp_enum);
  lVar6 = G_log_level;
  while ((G_log_level = lVar6, pmVar8 != (const_matchp)0x0 &&
         (uVar11 = (ulong)pmVar8->len, uVar11 != 0))) {
    if ((pmVar8->offset != 0) &&
       ((iVar7 = optimal_optimize::len_arr[uVar11], optimal_optimize::len_arr[uVar11] = iVar7 + 1,
        iVar7 < -1 && (~LOG_DEBUG < G_log_level)))) {
      G_log_log_level = LOG_ERROR;
      log_log_default("len counter wrapped!\n");
    }
    pmVar8 = (*f)(matchp_enum);
    lVar6 = G_log_level;
  }
  lVar14 = 0xfffe;
  do {
    piVar1 = optimal_optimize::len_arr + lVar14;
    *piVar1 = *piVar1 + optimal_optimize::len_arr[lVar14 + 1];
    if ((*piVar1 < 0) && (~LOG_DEBUG < lVar6)) {
      G_log_log_level = LOG_ERROR;
      log_log_default("len counter wrapped!\n");
      lVar6 = G_log_level;
    }
    bVar15 = lVar14 != 0;
    lVar14 = lVar14 + -1;
  } while (bVar15);
  p_Var9 = exo_optimize(optimal_optimize::len_arr,(int *)0x0,0x10,-1);
  *(interval_nodep *)((long)pvVar4 + 0x30) = p_Var9;
  pmVar8 = (*f)(matchp_enum);
  do {
    if ((pmVar8 == (const_matchp)0x0) || (uVar2 = pmVar8->len, uVar2 == 0)) {
      lVar14 = 0x1b04a8;
      lVar10 = 0x3b04a8;
      lVar12 = 0xfffe;
      do {
        lVar13 = 0;
        do {
          *(int *)(lVar14 + lVar13) = *(int *)(lVar14 + lVar13) + *(int *)(lVar14 + 4 + lVar13);
          *(int *)(lVar10 + lVar13) = *(int *)(lVar10 + lVar13) + *(int *)(lVar10 + 4 + lVar13);
          lVar13 = lVar13 + 0x40000;
        } while (lVar13 != 0x200000);
        lVar14 = lVar14 + -4;
        lVar10 = lVar10 + -4;
        bVar15 = lVar12 != 0;
        lVar12 = lVar12 + -1;
      } while (bVar15);
      p_Var9 = exo_optimize(optimal_optimize::offset_arr[0],optimal_optimize::offset_parr[0],4,2);
      *puVar5 = p_Var9;
      p_Var9 = exo_optimize(optimal_optimize::offset_arr[1],optimal_optimize::offset_parr[1],0x10,4)
      ;
      puVar5[1] = p_Var9;
      p_Var9 = exo_optimize(optimal_optimize::offset_arr[2],optimal_optimize::offset_parr[2],0x10,4)
      ;
      puVar5[2] = p_Var9;
      p_Var9 = exo_optimize(optimal_optimize::offset_arr[3],optimal_optimize::offset_parr[3],0x10,4)
      ;
      puVar5[3] = p_Var9;
      p_Var9 = exo_optimize(optimal_optimize::offset_arr[4],optimal_optimize::offset_parr[4],0x10,4)
      ;
      puVar5[4] = p_Var9;
      p_Var9 = exo_optimize(optimal_optimize::offset_arr[5],optimal_optimize::offset_parr[5],0x10,4)
      ;
      puVar5[5] = p_Var9;
      p_Var9 = exo_optimize(optimal_optimize::offset_arr[6],optimal_optimize::offset_parr[6],0x10,4)
      ;
      puVar5[6] = p_Var9;
      p_Var9 = exo_optimize(optimal_optimize::offset_arr[7],optimal_optimize::offset_parr[7],0x10,4)
      ;
      puVar5[7] = p_Var9;
      if (~LOG_ERROR < G_log_level) {
        optimal_dump(0x1e,emd);
        return;
      }
      return;
    }
    if (pmVar8->offset != 0) {
      fVar16 = optimal_encode_int((uint)uVar2,*(void **)((long)pvVar4 + 0x30),(output_ctxp)0x0);
      iVar7 = ~(int)fVar16 + (uint)uVar2 + (uint)uVar2 * 8;
      uVar3 = pmVar8->len;
      if (uVar3 == 1) {
        uVar2 = pmVar8->offset;
        optimal_optimize::offset_parr[0][uVar2] = optimal_optimize::offset_parr[0][uVar2] + iVar7;
        iVar7 = optimal_optimize::offset_arr[0][uVar2];
        optimal_optimize::offset_arr[0][uVar2] = iVar7 + 1;
        if (iVar7 < -1) {
          printf_str = "offset0 counter wrapped!\n";
          goto joined_r0x0010ef80;
        }
      }
      else if (uVar3 == 2) {
        uVar2 = pmVar8->offset;
        optimal_optimize::offset_parr[1][uVar2] = optimal_optimize::offset_parr[1][uVar2] + iVar7;
        iVar7 = optimal_optimize::offset_arr[1][uVar2];
        optimal_optimize::offset_arr[1][uVar2] = iVar7 + 1;
        if (iVar7 < -1) {
          printf_str = "offset1 counter wrapped!\n";
          goto joined_r0x0010ef80;
        }
      }
      else {
        if (uVar3 == 0) {
          if (~LOG_DEBUG < G_log_level) {
            G_log_log_level = LOG_ERROR;
            log_log_default("bad len\n");
          }
          exit(0);
        }
        uVar2 = pmVar8->offset;
        optimal_optimize::offset_parr[7][uVar2] = optimal_optimize::offset_parr[7][uVar2] + iVar7;
        iVar7 = optimal_optimize::offset_arr[7][uVar2];
        optimal_optimize::offset_arr[7][uVar2] = iVar7 + 1;
        if (iVar7 < -1) {
          printf_str = "offset7 counter wrapped!\n";
joined_r0x0010ef80:
          if (~LOG_DEBUG < G_log_level) {
            G_log_log_level = LOG_ERROR;
            log_log_default(printf_str);
          }
        }
      }
    }
    pmVar8 = (*f)(matchp_enum);
  } while( true );
}

Assistant:

void optimal_optimize(encode_match_data emd,    /* IN/OUT */
                      matchp_enum_get_next_f * f,       /* IN */
                      void *matchp_enum)        /* IN */
{
    encode_match_privp data;
    const_matchp mp;
    interval_nodep *offset;
    static int offset_arr[8][65536];
    static int offset_parr[8][65536];
    static int len_arr[65536];
    int treshold;

    int i, j;
    void *priv1;

    data = emd->priv;

    memset(offset_arr, 0, sizeof(offset_arr));
    memset(offset_parr, 0, sizeof(offset_parr));
    memset(len_arr, 0, sizeof(len_arr));

    offset = data->offset_f_priv;

    /* first the lens */
    priv1 = matchp_enum;
#if 0
    while ((mp = f(priv1)) != NULL)
    {
        LOG(LOG_DEBUG, ("%p len %d offset %d\n", mp, mp->len, mp->offset));
    }
    if(mp->len < 0)
    {
        LOG(LOG_ERROR, ("the horror, negative len!\n"));
    }
#endif
    while ((mp = f(priv1)) != NULL && mp->len > 0)
    {
        if (mp->offset > 0)
        {
            len_arr[mp->len] += 1;
            if(len_arr[mp->len] < 0)
            {
                LOG(LOG_ERROR, ("len counter wrapped!\n"));
            }
        }
    }

    for (i = 65534; i >= 0; --i)
    {
        len_arr[i] += len_arr[i + 1];
        if(len_arr[i] < 0)
        {
            LOG(LOG_ERROR, ("len counter wrapped!\n"));
        }
    }

    data->len_f_priv = exo_optimize(len_arr, NULL, 16, -1);

    /* then the offsets */
    priv1 = matchp_enum;
    while ((mp = f(priv1)) != NULL && mp->len > 0)
    {
        if (mp->offset > 0)
        {
            treshold = mp->len * 9;
            treshold -= 1 + (int) optimal_encode_int(mp->len,
                                                     data->len_f_priv,
                                                     NULL);
            switch (mp->len)
            {
            case 0:
                LOG(LOG_ERROR, ("bad len\n"));
                exit(0);
                break;
            case 1:
                offset_parr[0][mp->offset] += treshold;
                offset_arr[0][mp->offset] += 1;
                if(offset_arr[0][mp->offset] < 0)
                {
                    LOG(LOG_ERROR, ("offset0 counter wrapped!\n"));
                }
                break;
            case 2:
                offset_parr[1][mp->offset] += treshold;
                offset_arr[1][mp->offset] += 1;
                if(offset_arr[1][mp->offset] < 0)
                {
                    LOG(LOG_ERROR, ("offset1 counter wrapped!\n"));
                }
                break;
            default:
                offset_parr[7][mp->offset] += treshold;
                offset_arr[7][mp->offset] += 1;
                if(offset_arr[7][mp->offset] < 0)
                {
                    LOG(LOG_ERROR, ("offset7 counter wrapped!\n"));
                }
                break;
            }
        }
    }

    for (i = 65534; i >= 0; --i)
    {
        for (j = 0; j < 8; ++j)
        {
            offset_arr[j][i] += offset_arr[j][i + 1];
            offset_parr[j][i] += offset_parr[j][i + 1];
        }
    }

    offset[0] = exo_optimize(offset_arr[0], offset_parr[0], 1 << 2, 2);
    offset[1] = exo_optimize(offset_arr[1], offset_parr[1], 1 << 4, 4);
    offset[2] = exo_optimize(offset_arr[2], offset_parr[2], 1 << 4, 4);
    offset[3] = exo_optimize(offset_arr[3], offset_parr[3], 1 << 4, 4);
    offset[4] = exo_optimize(offset_arr[4], offset_parr[4], 1 << 4, 4);
    offset[5] = exo_optimize(offset_arr[5], offset_parr[5], 1 << 4, 4);
    offset[6] = exo_optimize(offset_arr[6], offset_parr[6], 1 << 4, 4);
    offset[7] = exo_optimize(offset_arr[7], offset_parr[7], 1 << 4, 4);

    if(IS_LOGGABLE(LOG_DEBUG))
    {
        optimal_dump(LOG_DEBUG, emd);
    }
}